

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_rest(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  
  if ((((data->req).p.file)->fd != 0) && ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"REST %d",0);
    if (CVar1 == CURLE_OK) {
      _ftp_state(data,'\x1a');
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_prepare_transfer(data);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_rest(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer != PPTRANSFER_BODY) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* Determine if server can respond to REST command and therefore
       whether it supports range */
    result = Curl_pp_sendf(data, &ftpc->pp, "REST %d", 0);
    if(!result)
      ftp_state(data, FTP_REST);
  }
  else
    result = ftp_state_prepare_transfer(data);

  return result;
}